

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void GC::MarkPendingRoots(void)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  
  plVar3 = curr;
  plVar4 = next;
  if (next != (long *)0x0) {
    uVar1 = *(uint *)((long)next + 0xc);
    plVar5 = next;
    next = curr;
    while (curr = plVar5, uVar1 != 0) {
      lVar2 = *curr;
      lVar6 = 0;
      do {
        CheckBasePointer(*(char **)(lVar2 + lVar6));
        plVar5 = next;
        plVar3 = curr;
        lVar6 = lVar6 + 8;
      } while ((ulong)uVar1 << 3 != lVar6);
      *(undefined4 *)((long)curr + 0xc) = 0;
      uVar1 = *(uint *)((long)plVar5 + 0xc);
      plVar4 = next;
      next = plVar3;
      plVar3 = curr;
    }
  }
  next = plVar4;
  curr = plVar3;
  return;
}

Assistant:

void GC::MarkPendingRoots()
{
	if(!GC::next)
		return;

	if(GC::next->empty())
		return;

	while(GC::next->size())
	{
		GC_DEBUG_PRINT("Checking new roots\n");

		FastVector<char*> *tmp = GC::curr;
		GC::curr = GC::next;
		GC::next = tmp;

		for(char **c = GC::curr->data, **e = GC::curr->data + GC::curr->size(); c != e; c++)
		{
			GC_DEBUG_PRINT("\tRoot pointer base is %p\n", *c);

			GC::CheckBasePointer(*c);
		}

		GC::curr->clear();
	}

	GC_DEBUG_PRINT("\n");
}